

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  __tuple_element_t<0UL,_tuple<int,_sockaddr_in>_> *p_Var2;
  ostream *poVar3;
  reference_type pbVar4;
  socklen_t in_ECX;
  undefined4 in_register_0000000c;
  undefined4 extraout_EDX;
  int __n;
  undefined4 extraout_EDX_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar5;
  undefined1 local_b8 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  line_read;
  Reader client_reader;
  undefined1 local_60 [4];
  int fd;
  tuple<int,_sockaddr_in> result;
  undefined1 local_40 [8];
  Socket sk;
  char **argv_local;
  int argc_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  argv_local._4_4_ = 0;
  _argc_local = &argv_local;
  local_10 = &sk.fd_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  sk.fd_.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv;
  argv_local._0_4_ = argc;
  rookie::Socket::Socket((Socket *)local_40);
  iVar5 = 0x18aa;
  rookie::Socket::bind
            ((Socket *)local_40,0x18aa,(sockaddr *)CONCAT44(extraout_var,extraout_EDX),in_ECX);
  rookie::Socket::listen((Socket *)local_40,iVar5,__n);
  rookie::Socket::accept
            ((Socket *)local_60,(int)local_40,(sockaddr *)CONCAT44(extraout_var_00,extraout_EDX_00),
             (socklen_t *)CONCAT44(in_register_0000000c,in_ECX));
  p_Var2 = std::get<0ul,int,sockaddr_in>((tuple<int,_sockaddr_in> *)local_60);
  iVar5 = *p_Var2;
  poVar3 = std::operator<<((ostream *)&std::cout,"Connection established! fd is ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar5);
  poVar3 = std::operator<<(poVar3,".");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  rookie::Reader::Reader((Reader *)((long)&line_read.super_type.m_storage.dummy_ + 0x18),iVar5);
  do {
    rookie::Reader::readLine_abi_cxx11_
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_b8,(Reader *)((long)&line_read.super_type.m_storage.dummy_ + 0x18));
    bVar1 = boost::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator!((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_b8);
    if (!bVar1) {
      pbVar4 = boost::
               optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_b8);
      std::operator<<((ostream *)&std::cout,(string *)pbVar4);
    }
    boost::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_b8);
  } while (!bVar1);
  argv_local._4_4_ = 0;
  rookie::Reader::~Reader((Reader *)((long)&line_read.super_type.m_storage.dummy_ + 0x18));
  rookie::Socket::~Socket((Socket *)local_40);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]){
    boost::ignore_unused(argc);
    boost::ignore_unused(argv);

    Socket sk;
    sk.bind(6314);
    sk.listen();
    auto result = sk.accept();
    int fd = std::get<0>(result);
    std::cout << "Connection established! fd is " << fd << "." << std::endl;

    Reader client_reader(fd);

    for( ; ; ){
        boost::optional<std::string> line_read = client_reader.readLine();
        if (!line_read) break;
        std::cout << line_read.value();
    }
    return 0;
}